

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O2

bool __thiscall
CoreML::Specification::LossLayer::MergePartialFromCodedStream
          (LossLayer *this,CodedInputStream *input)

{
  byte bVar1;
  byte *pbVar2;
  bool bVar3;
  uint32 uVar4;
  uint uVar5;
  string *psVar6;
  CategoricalCrossEntropyLossLayer *value;
  MeanSquaredErrorLossLayer *value_00;
  char cVar7;
  ulong uVar8;
  
LAB_001eb51f:
  pbVar2 = input->buffer_;
  uVar4 = 0;
  if (pbVar2 < input->buffer_end_) {
    bVar1 = *pbVar2;
    uVar4 = (uint32)bVar1;
    if ((char)bVar1 < '\x01') goto LAB_001eb542;
    input->buffer_ = pbVar2 + 1;
    uVar8 = (ulong)bVar1 | 0x100000000;
  }
  else {
LAB_001eb542:
    uVar4 = google::protobuf::io::CodedInputStream::ReadTagFallback(input,uVar4);
    uVar8 = 0;
    if (uVar4 - 1 < 0x7f) {
      uVar8 = 0x100000000;
    }
    uVar8 = uVar4 | uVar8;
  }
  uVar4 = (uint32)uVar8;
  if ((uVar8 & 0x100000000) != 0) {
    uVar5 = (uint)(uVar8 >> 3) & 0x1fffffff;
    cVar7 = (char)uVar8;
    if (uVar5 == 0xb) {
      if (cVar7 != 'Z') goto LAB_001eb563;
      value_00 = mutable_meansquarederrorlosslayer(this);
      bVar3 = google::protobuf::internal::WireFormatLite::
              ReadMessageNoVirtual<CoreML::Specification::MeanSquaredErrorLossLayer>(input,value_00)
      ;
      goto LAB_001eb584;
    }
    if (uVar5 != 10) {
      if ((uVar5 != 1) || (cVar7 != '\n')) goto LAB_001eb563;
      psVar6 = mutable_name_abi_cxx11_(this);
      bVar3 = google::protobuf::internal::WireFormatLite::ReadBytes(input,psVar6);
      if (!bVar3) {
        return false;
      }
      psVar6 = (this->name_).ptr_;
      bVar3 = google::protobuf::internal::WireFormatLite::VerifyUtf8String
                        ((psVar6->_M_dataplus)._M_p,(int)psVar6->_M_string_length,PARSE,
                         "CoreML.Specification.LossLayer.name");
      if (!bVar3) {
        return false;
      }
      goto LAB_001eb51f;
    }
    if (cVar7 == 'R') {
      value = mutable_categoricalcrossentropylosslayer(this);
      bVar3 = google::protobuf::internal::WireFormatLite::
              ReadMessageNoVirtual<CoreML::Specification::CategoricalCrossEntropyLossLayer>
                        (input,value);
      goto LAB_001eb584;
    }
  }
LAB_001eb563:
  if (uVar4 == 0) {
    return true;
  }
  if ((uVar4 & 7) == 4) {
    return true;
  }
  bVar3 = google::protobuf::internal::WireFormatLite::SkipField(input,uVar4);
LAB_001eb584:
  if (bVar3 == false) {
    return false;
  }
  goto LAB_001eb51f;
}

Assistant:

bool LossLayer::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:CoreML.Specification.LossLayer)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(127u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // string name = 1;
      case 1: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(10u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_name()));
          DO_(::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
            this->name().data(), this->name().length(),
            ::google::protobuf::internal::WireFormatLite::PARSE,
            "CoreML.Specification.LossLayer.name"));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.CategoricalCrossEntropyLossLayer categoricalCrossEntropyLossLayer = 10;
      case 10: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(82u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_categoricalcrossentropylosslayer()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.MeanSquaredErrorLossLayer meanSquaredErrorLossLayer = 11;
      case 11: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(90u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_meansquarederrorlosslayer()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        DO_(::google::protobuf::internal::WireFormatLite::SkipField(input, tag));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:CoreML.Specification.LossLayer)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:CoreML.Specification.LossLayer)
  return false;
#undef DO_
}